

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::DummyDataParameter::DummyDataParameter(DummyDataParameter *this,DummyDataParameter *from)

{
  int iVar1;
  void *pvVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DummyDataParameter_006f94d0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->data_filler_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->data_filler_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->data_filler_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->data_filler_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::FillerParameter>::TypeHandler>
            (&(this->data_filler_).super_RepeatedPtrFieldBase,
             &(from->data_filler_).super_RepeatedPtrFieldBase);
  (this->num_).current_size_ = 0;
  (this->num_).total_size_ = 0;
  (this->num_).rep_ = (Rep *)0x0;
  iVar1 = (from->num_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve(&this->num_,iVar1);
    memcpy(((this->num_).rep_)->elements,((from->num_).rep_)->elements,
           (long)(from->num_).current_size_ << 2);
    (this->num_).current_size_ = (from->num_).current_size_;
  }
  (this->channels_).current_size_ = 0;
  (this->channels_).total_size_ = 0;
  (this->channels_).rep_ = (Rep *)0x0;
  iVar1 = (from->channels_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve(&this->channels_,iVar1);
    memcpy(((this->channels_).rep_)->elements,((from->channels_).rep_)->elements,
           (long)(from->channels_).current_size_ << 2);
    (this->channels_).current_size_ = (from->channels_).current_size_;
  }
  (this->height_).current_size_ = 0;
  (this->height_).total_size_ = 0;
  (this->height_).rep_ = (Rep *)0x0;
  iVar1 = (from->height_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve(&this->height_,iVar1);
    memcpy(((this->height_).rep_)->elements,((from->height_).rep_)->elements,
           (long)(from->height_).current_size_ << 2);
    (this->height_).current_size_ = (from->height_).current_size_;
  }
  (this->width_).current_size_ = 0;
  (this->width_).total_size_ = 0;
  (this->width_).rep_ = (Rep *)0x0;
  iVar1 = (from->width_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve(&this->width_,iVar1);
    memcpy(((this->width_).rep_)->elements,((from->width_).rep_)->elements,
           (long)(from->width_).current_size_ << 2);
    (this->width_).current_size_ = (from->width_).current_size_;
  }
  (this->shape_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->shape_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->shape_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->shape_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
            (&(this->shape_).super_RepeatedPtrFieldBase,&(from->shape_).super_RepeatedPtrFieldBase);
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

DummyDataParameter::DummyDataParameter(const DummyDataParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      data_filler_(from.data_filler_),
      num_(from.num_),
      channels_(from.channels_),
      height_(from.height_),
      width_(from.width_),
      shape_(from.shape_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:caffe.DummyDataParameter)
}